

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O3

int fits_parser_workfn(long totalrows,long offset,long firstrow,long nrows,int nCols,
                      iteratorCol *colData,void *userPtr)

{
  byte *pbVar1;
  double dVar2;
  char cVar3;
  int iVar4;
  DataInfo *pDVar5;
  undefined8 *__dest;
  Node *pNVar6;
  Node *pNVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  Node *pNVar11;
  int *piVar12;
  long lVar13;
  char *pcVar14;
  char *pcVar15;
  long *plVar16;
  void *pvVar17;
  undefined8 *puVar18;
  lval *plVar19;
  Node *pNVar20;
  undefined4 uVar21;
  Node *pNVar22;
  long lVar23;
  long lVar24;
  undefined8 uVar25;
  double *pdVar26;
  ParseData *pPVar27;
  size_t __size;
  byte bVar28;
  long lVar29;
  uint uVar30;
  Node *pNVar31;
  iteratorCol *piVar32;
  iteratorCol *piVar33;
  bool bVar34;
  ulong local_128;
  Node *local_120;
  Node *local_118;
  int local_10c;
  Node *local_108;
  int *local_100;
  iteratorCol *local_f8;
  ParseData *local_f0;
  Node *local_e8;
  long local_e0;
  Node *local_d8;
  iteratorCol *local_d0;
  int status;
  long local_c0;
  size_t local_b8;
  long local_b0;
  long zeros [4];
  char undef;
  
  pNVar20 = (Node *)(ulong)(uint)nCols;
  local_10c = 0;
  pPVar27 = *(ParseData **)((long)userPtr + 0x28);
  zeros[2] = 0;
  zeros[3] = 0;
  zeros[0] = 0;
  zeros[1] = 0;
  local_f8 = colData;
  if (DEBUG_PIXFILTER != 0) {
    local_118 = (Node *)nrows;
    printf("fits_parser_workfn(total=%ld, offset=%ld, first=%ld, rows=%ld, cols=%d)\n",totalrows,
           offset,firstrow,nrows,pNVar20);
    nrows = (long)local_118;
  }
  piVar33 = local_f8 + nCols;
  local_f0 = pPVar27;
  local_d0 = piVar33;
  local_c0 = totalrows;
  if (offset + 1 == firstrow) {
    *(void **)((long)userPtr + 0x68) = userPtr;
    *(undefined4 *)((long)userPtr + 0x20) = 0;
    local_128 = 0;
    if (0 < nCols) {
      piVar32 = pPVar27->colData;
      do {
        piVar32[local_128].repeat = local_f8[local_128].repeat;
        local_128 = local_128 + 1;
      } while ((long)local_128 < (long)nCols);
    }
    pNVar31 = *(Node **)((long)userPtr + 0x18);
    if ((long)pNVar31 < 1) {
      pNVar11 = (Node *)totalrows;
      if (pNVar31 == (Node *)0x0) {
        pNVar11 = (Node *)nrows;
      }
    }
    else {
      pNVar11 = pNVar31;
      if (totalrows <= (long)pNVar31) {
        pNVar11 = (Node *)totalrows;
      }
    }
    *(Node **)((long)userPtr + 0x18) = pNVar11;
    *(long *)((long)userPtr + 0x48) = (long)pNVar11->SubNodes + firstrow + -0x15;
    piVar12 = (int *)userPtr;
    if (*(long *)((long)userPtr + 8) == 0) {
      iVar9 = piVar33[-1].iotype;
      if (iVar9 == 0) {
        ffpmsg("Output column for parser results not found!");
        return 0x1b2;
      }
      *(void **)((long)userPtr + 0x38) = piVar33[-1].array;
      *(int *)userPtr = piVar33[-1].datatype;
      status = 0;
      *(undefined8 *)((long)userPtr + 0x60) = 0;
      if (pPVar27->hdutype == 0) {
        lVar13 = pPVar27->pixFilter->blank;
        if (lVar13 != 0) goto LAB_00125964;
      }
      else {
        if ((iVar9 == 3) ||
           (ffgknjj(piVar33[-1].fptr,"TNULL",piVar33[-1].colnum,1,(LONGLONG *)((long)userPtr + 0x60)
                    ,(int *)&local_128,&status), status != 0x193)) {
          piVar12 = *(int **)((long)userPtr + 0x68);
          if (piVar33[-1].iotype != 3) goto LAB_00125968;
        }
        else {
          piVar12 = *(int **)((long)userPtr + 0x68);
        }
        iVar9 = *piVar12;
        if (iVar9 == 0x15) {
          lVar13 = -0x8000;
        }
        else if (iVar9 == 0x29) {
          lVar13 = -0x8000000000000000;
        }
        else {
          if (iVar9 != 0x1f) goto LAB_00125968;
          lVar13 = -0x80000000;
        }
LAB_00125964:
        *(long *)((long)userPtr + 0x60) = lVar13;
      }
LAB_00125968:
      plVar19 = (lval *)&piVar33[-1].repeat;
    }
    else {
      *(long *)((long)userPtr + 0x30) = *(long *)((long)userPtr + 8);
      plVar16 = zeros;
      if (*(long **)((long)userPtr + 0x10) != (long *)0x0) {
        plVar16 = *(long **)((long)userPtr + 0x10);
      }
      *(long **)((long)userPtr + 0x38) = plVar16;
      plVar19 = &pPVar27->Nodes[pPVar27->resultNode].value;
    }
    *(long *)((long)userPtr + 0x50) = plVar19->nelem;
    iVar9 = *piVar12;
    if (iVar9 < 0x1f) {
      uVar21 = 1;
      if (iVar9 < 0xe) {
        if ((iVar9 != 1) && (iVar9 != 0xb)) goto LAB_001259d9;
      }
      else if (iVar9 != 0xe) {
        if (iVar9 == 0x10) goto LAB_001259c9;
        if (iVar9 != 0x15) goto LAB_001259d9;
        uVar21 = 2;
      }
LAB_001259d5:
      *(undefined4 *)((long)userPtr + 0x40) = uVar21;
    }
    else if (iVar9 < 0x2a) {
      if (iVar9 == 0x1f) goto LAB_001259d0;
      if (iVar9 == 0x29) goto LAB_001259c9;
    }
    else {
      if (iVar9 == 0x2a) {
LAB_001259d0:
        uVar21 = 4;
        goto LAB_001259d5;
      }
      if ((iVar9 == 0x51) || (iVar9 == 0x52)) {
LAB_001259c9:
        uVar21 = 8;
        goto LAB_001259d5;
      }
    }
LAB_001259d9:
    iVar9 = local_f0->Nodes[local_f0->resultNode].type;
    if ((iVar9 == 0x104) || (iVar9 == 0x103)) {
      *(undefined8 *)((long)userPtr + 0x58) = 8;
    }
    else if (iVar9 == 0x102) {
      *(undefined8 *)((long)userPtr + 0x58) = 1;
    }
  }
  else {
    piVar12 = *(int **)((long)userPtr + 0x68);
  }
  if (*(long *)(piVar12 + 2) != 0) goto LAB_00125a22;
  *(long *)((long)userPtr + 0x30) = (long)*(int *)((long)userPtr + 0x40) + (long)piVar33[-1].array;
  if ((piVar33[-1].iotype == 3) && (*(long *)(piVar12 + 4) != 0)) {
    *(long *)((long)userPtr + 0x38) = *(long *)(piVar12 + 4);
    goto LAB_00125a22;
  }
  iVar9 = *piVar12;
  if (iVar9 < 0x1f) {
    if (iVar9 < 0x10) {
      if (iVar9 == 0xb) {
        **(undefined1 **)((long)userPtr + 0x38) = *(undefined1 *)((long)userPtr + 0x60);
      }
      else if (iVar9 == 0xe) {
        **(undefined1 **)((long)userPtr + 0x38) = 0x55;
      }
    }
    else if (iVar9 == 0x10) {
      *(undefined1 *)**(undefined8 **)((long)userPtr + 0x38) = 1;
      *(undefined1 *)(**(long **)((long)userPtr + 0x38) + 1) = 0;
    }
    else if (iVar9 == 0x15) {
      **(undefined2 **)((long)userPtr + 0x38) = *(undefined2 *)((long)userPtr + 0x60);
    }
    goto LAB_00125a22;
  }
  if (iVar9 < 0x2a) {
    if (iVar9 == 0x1f) {
      **(undefined4 **)((long)userPtr + 0x38) = *(undefined4 *)((long)userPtr + 0x60);
      goto LAB_00125a22;
    }
    if (iVar9 != 0x29) goto LAB_00125a22;
LAB_00125fa9:
    puVar18 = *(undefined8 **)((long)userPtr + 0x38);
    uVar25 = *(undefined8 *)((long)userPtr + 0x60);
  }
  else {
    if (iVar9 == 0x2a) {
      **(undefined4 **)((long)userPtr + 0x38) = 0x8541f136;
      goto LAB_00125a22;
    }
    if (iVar9 == 0x51) goto LAB_00125fa9;
    if (iVar9 != 0x52) goto LAB_00125a22;
    puVar18 = *(undefined8 **)((long)userPtr + 0x38);
    uVar25 = 0xb8a83e285ebab4b7;
  }
  *puVar18 = uVar25;
LAB_00125a22:
  local_b0 = *(long *)((long)userPtr + 0x30);
  lVar13 = *(long *)((long)userPtr + 0x48) - firstrow;
  pNVar31 = (Node *)(lVar13 + 1);
  if (nrows <= lVar13) {
    pNVar31 = (Node *)nrows;
  }
  local_f0->firstDataRow = firstrow;
  local_f0->nDataRows = (long)pNVar31;
  pPVar27 = local_f0;
  pNVar11 = pNVar31;
  if (0 < nCols) {
    local_e8 = (Node *)local_f0->nPrevDataRows;
    local_b8 = (long)pNVar31 * 8;
    piVar12 = (int *)0x0;
    pNVar22 = (Node *)0x0;
    piVar33 = local_f8;
    local_108 = pNVar31;
    local_e0 = firstrow;
    local_d8 = pNVar20;
    do {
      piVar32 = local_f8;
      if ((piVar33[(long)pNVar22].iotype & 0xfffffffeU) != 2) {
        pDVar5 = pPVar27->varData;
        local_120 = pNVar22;
        local_100 = piVar12;
        if (pDVar5[(long)pNVar22].type - 0x102U < 5) {
          lVar13 = pDVar5[(long)pNVar22].nelem;
          __size = lVar13 * (long)pNVar31;
          switch(pDVar5[(long)pNVar22].type) {
          case 0x102:
            pcVar15 = (char *)piVar33[(long)pNVar22].array;
            if (local_e8 != pNVar31) {
              if (pDVar5[(long)pNVar22].undef != (char *)0x0) {
                free(pDVar5[(long)pNVar22].undef);
              }
              pcVar14 = (char *)malloc(__size);
              pDVar5[(long)pNVar22].undef = pcVar14;
              pNVar31 = local_108;
              if (pcVar14 == (char *)0x0) goto LAB_00126024;
            }
            for (; __size != 0; __size = __size - 1) {
              if (*pcVar15 == '\0') {
                bVar34 = false;
              }
              else {
                bVar34 = *pcVar15 == pcVar15[__size];
              }
              pDVar5[(long)pNVar22].undef[__size - 1] = bVar34;
            }
            pdVar26 = (double *)(pcVar15 + 1);
            goto LAB_00125d5a;
          case 0x103:
            pdVar26 = (double *)piVar33[(long)pNVar22].array;
            if (local_e8 != pNVar31) {
              if (pDVar5[(long)pNVar22].undef != (char *)0x0) {
                free(pDVar5[(long)pNVar22].undef);
              }
              pcVar15 = (char *)malloc(__size);
              pDVar5[(long)pNVar22].undef = pcVar15;
              pNVar31 = local_108;
              if (pcVar15 == (char *)0x0) goto LAB_00126024;
            }
            for (; __size != 0; __size = __size - 1) {
              if (*pdVar26 == 0.0) {
                bVar34 = false;
              }
              else {
                bVar34 = *pdVar26 == pdVar26[__size];
              }
              pDVar5[(long)pNVar22].undef[__size - 1] = bVar34;
            }
            break;
          case 0x104:
            pdVar26 = (double *)piVar33[(long)pNVar22].array;
            if (local_e8 != pNVar31) {
              if (pDVar5[(long)pNVar22].undef != (char *)0x0) {
                free(pDVar5[(long)pNVar22].undef);
              }
              pcVar15 = (char *)malloc(__size);
              pDVar5[(long)pNVar22].undef = pcVar15;
              pNVar31 = local_108;
              if (pcVar15 == (char *)0x0) goto LAB_00126024;
            }
            for (; __size != 0; __size = __size - 1) {
              dVar2 = *pdVar26;
              if ((dVar2 != 0.0) || (NAN(dVar2))) {
                bVar8 = -(dVar2 == pdVar26[__size]) & 1;
              }
              else {
                bVar8 = 0;
              }
              pDVar5[(long)pNVar22].undef[__size - 1] = bVar8;
            }
            break;
          case 0x105:
            puVar18 = (undefined8 *)piVar33[(long)pNVar22].array;
            pNVar20 = pNVar31;
            pNVar11 = pNVar22;
            pNVar6 = local_d8;
            if (local_e8 != pNVar31) {
              if (pDVar5[(long)pNVar22].undef != (char *)0x0) {
                free(pDVar5[(long)pNVar22].undef);
                pNVar31 = local_108;
              }
              pcVar15 = (char *)malloc((size_t)pNVar31);
              pDVar5[(long)pNVar22].undef = pcVar15;
              pNVar20 = local_108;
              pNVar31 = local_108;
              pNVar11 = local_120;
              piVar12 = local_100;
              pNVar6 = local_d8;
              if (pcVar15 == (char *)0x0) goto LAB_00126024;
            }
            for (; pNVar7 = local_d8, pNVar20 != (Node *)0x0;
                pNVar20 = (Node *)((long)&pNVar20[-1].value.data.dbl + 0xff)) {
              cVar3 = *(char *)*puVar18;
              if ((cVar3 == '\0') || (cVar3 != *(char *)puVar18[(long)pNVar20])) {
                bVar34 = false;
                local_d8 = pNVar6;
              }
              else {
                local_d8 = pNVar6;
                iVar9 = strcmp((char *)*puVar18,(char *)puVar18[(long)pNVar20]);
                bVar34 = iVar9 == 0;
                pNVar11 = local_120;
                pNVar31 = local_108;
                piVar12 = local_100;
              }
              (pDVar5[(long)pNVar22].undef + -1)[(long)pNVar20] = bVar34;
              pNVar6 = local_d8;
              local_d8 = pNVar7;
            }
            pDVar5[(long)pNVar22].data = puVar18 + 1;
            pNVar22 = pNVar11;
            pPVar27 = local_f0;
            pNVar20 = local_d8;
            local_d8 = pNVar6;
            goto LAB_00125ed2;
          case 0x106:
            local_118 = (Node *)(lVar13 + 1);
            plVar16 = (long *)pDVar5[(long)pNVar22].data;
            if (local_e8 == pNVar31) {
LAB_00125e16:
              if (0 < (long)pNVar31) {
                lVar24 = lVar13 + 0xe;
                if (-1 < lVar13 + 7) {
                  lVar24 = lVar13 + 7;
                }
                pNVar20 = (Node *)0x0;
                do {
                  lVar23 = (long)pNVar20 * (long)local_118 + *plVar16;
                  plVar16[(long)pNVar20] = lVar23;
                  if (lVar13 < 1) {
                    lVar29 = 0;
                  }
                  else {
                    lVar23 = (long)pNVar20 * (lVar24 >> 3) + 1;
                    lVar29 = 0;
                    do {
                      uVar30 = (uint)lVar29 & 7;
                      *(byte *)(plVar16[(long)pNVar20] + lVar29) =
                           (*(byte *)((long)piVar33[(long)pNVar22].array + lVar23) >>
                            ((byte)uVar30 ^ 7) & 1) == 0 ^ 0x31;
                      lVar23 = lVar23 + (ulong)(uVar30 == 7);
                      lVar29 = lVar29 + 1;
                    } while (lVar13 != lVar29);
                    lVar23 = plVar16[(long)pNVar20];
                    lVar29 = lVar13;
                  }
                  *(undefined1 *)(lVar23 + lVar29) = 0;
                  pNVar20 = (Node *)((long)&pNVar20->operation + 1);
                } while (pNVar20 != pNVar31);
              }
              pDVar5[(long)pNVar22].undef = (char *)plVar16;
              pDVar5[(long)pNVar22].data = plVar16;
              pNVar22 = local_120;
              pNVar20 = local_d8;
              piVar12 = local_100;
              piVar32 = local_f8;
              goto LAB_00125ed2;
            }
            if (plVar16 != (long *)0x0) {
              if ((void *)*plVar16 == (void *)0x0) {
                printf("invalid free(bitStrs[0]) at %s:%d\n",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                       ,0x599);
              }
              else {
                free((void *)*plVar16);
              }
            }
            free(plVar16);
            plVar16 = (long *)malloc(local_b8);
            if (plVar16 != (long *)0x0) {
              pvVar17 = malloc((long)local_118 * (long)local_108);
              *plVar16 = (long)pvVar17;
              pPVar27 = local_f0;
              pNVar31 = local_108;
              if (pvVar17 != (void *)0x0) goto LAB_00125e16;
              free(plVar16);
            }
            pDVar5[(long)pNVar22].undef = (char *)0x0;
            pDVar5[(long)pNVar22].data = (void *)0x0;
LAB_00126024:
            local_f0->status = 0x71;
            pNVar22 = local_120;
            pPVar27 = local_f0;
            pNVar31 = local_108;
            piVar12 = local_100;
            goto LAB_00126038;
          }
          pdVar26 = pdVar26 + 1;
LAB_00125d5a:
          pDVar5[(long)pNVar22].data = pdVar26;
          pNVar22 = local_120;
          pPVar27 = local_f0;
          pNVar20 = local_d8;
          piVar12 = local_100;
        }
        else {
          snprintf(&undef,0x50,"SetupDataArrays, unhandled type %d\n");
          ffpmsg(&undef);
          pNVar22 = local_120;
          pNVar31 = local_108;
          piVar12 = local_100;
          piVar32 = piVar33;
        }
LAB_00125ed2:
        piVar33 = piVar32;
        firstrow = local_e0;
        if (pPVar27->status != 0) {
LAB_00126038:
          if (pNVar22 == (Node *)0x0) {
            pNVar11 = (Node *)0x0;
            firstrow = local_e0;
          }
          else {
            do {
              pDVar5 = pPVar27->varData;
              if (*(int *)((long)&pDVar5[-1].type + (long)piVar12) == 0x106) {
                pvVar17 = (void *)**(undefined8 **)((long)&pDVar5[-1].data + (long)piVar12);
                if (pvVar17 == (void *)0x0) {
                  printf("invalid free(((char**)varData->data)[0]) at %s:%d\n",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                         ,0x60c);
                }
                else {
                  free(pvVar17);
                }
              }
              pvVar17 = *(void **)((long)&pDVar5[-1].undef + (long)piVar12);
              if (pvVar17 == (void *)0x0) {
                printf("invalid free(varData->undef) at %s:%d\n",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                       ,0x60d);
              }
              else {
                free(pvVar17);
              }
              *(undefined8 *)((long)&pDVar5[-1].undef + (long)piVar12) = 0;
              piVar12 = piVar12 + -0x28;
              pPVar27 = local_f0;
              pNVar31 = local_108;
              pNVar11 = (Node *)0x0;
              firstrow = local_e0;
            } while (piVar12 != (int *)0x0);
          }
          break;
        }
      }
      pNVar22 = (Node *)((long)&pNVar22->operation + 1);
      piVar12 = piVar12 + 0x28;
      pNVar11 = pNVar31;
    } while (pNVar22 != pNVar20);
  }
  pPVar27->nPrevDataRows = (long)pNVar11;
  if (pNVar31 != (Node *)0x0) {
    piVar12 = &pPVar27->status;
    iVar9 = 0;
    local_100 = piVar12;
    do {
      local_120 = (Node *)0x2710;
      if ((long)pNVar31 < 10000) {
        local_120 = pNVar31;
      }
      local_108 = pNVar31;
      Evaluate_Parser(pPVar27,firstrow,(long)local_120);
      if (pPVar27->status != 0) break;
      pNVar31 = pPVar27->Nodes;
      iVar10 = pPVar27->resultNode;
      pNVar20 = pNVar31 + iVar10;
      iVar4 = pNVar31[iVar10].type;
      if (pNVar31[iVar10].operation == -1000) {
        iVar9 = 1;
      }
      local_118 = pNVar20;
      if (iVar4 - 0x102U < 3) {
        local_e8 = (Node *)CONCAT44(local_e8._4_4_,iVar9);
        if (iVar9 == 0) {
          lVar24 = *(long *)((long)userPtr + 0x50);
          lVar13 = (pNVar20->value).nelem;
          if (lVar24 == lVar13) {
            ffcvtn(pPVar27->datatype,(pNVar20->value).data.ptr,(pNVar20->value).undef,
                   lVar24 * (long)local_120,**(int **)((long)userPtr + 0x68),
                   *(void **)((long)userPtr + 0x38),*(void **)((long)userPtr + 0x30),&local_10c,
                   piVar12);
            pNVar20 = local_118;
          }
          else if (lVar13 == 1) {
            if (0 < (long)local_108) {
              pNVar31 = (Node *)0x0;
              local_e0 = firstrow;
              do {
                piVar12 = local_100;
                local_128 = 0;
                if (0 < lVar24) {
                  do {
                    ffcvtn(pPVar27->datatype,
                           (double *)
                           (*(long *)((long)userPtr + 0x58) * (long)pNVar31 +
                           (long)(pNVar20->value).data.dblptr),
                           (pNVar20->value).undef + (long)pNVar31,1,**(int **)((long)userPtr + 0x68)
                           ,*(void **)((long)userPtr + 0x38),
                           (void *)((long)*(int *)((long)userPtr + 0x40) *
                                    (lVar24 * (long)pNVar31 + local_128) +
                                   *(long *)((long)userPtr + 0x30)),&local_10c,piVar12);
                    local_128 = local_128 + 1;
                    lVar24 = *(long *)((long)userPtr + 0x50);
                    pNVar20 = local_118;
                  } while ((long)local_128 < lVar24);
                }
                pNVar31 = (Node *)((long)&pNVar31->operation + 1);
                firstrow = local_e0;
              } while (pNVar31 != local_120);
            }
          }
          else if (0 < (long)local_108) {
            if (lVar24 < lVar13) {
              lVar13 = lVar24;
            }
            local_f8 = (iteratorCol *)(long)(int)lVar13;
            pNVar31 = (Node *)0x0;
            do {
              piVar33 = local_f8;
              lVar13 = (local_118->value).nelem * (long)pNVar31;
              ffcvtn(pPVar27->datatype,
                     (double *)
                     (*(long *)((long)userPtr + 0x58) * lVar13 +
                     (long)(local_118->value).data.dblptr),(local_118->value).undef + lVar13,
                     (long)local_f8,**(int **)((long)userPtr + 0x68),
                     *(void **)((long)userPtr + 0x38),
                     (void *)((long)*(int *)((long)userPtr + 0x40) *
                              *(long *)((long)userPtr + 0x50) * (long)pNVar31 +
                             *(long *)((long)userPtr + 0x30)),&local_10c,piVar12);
              lVar13 = *(long *)((long)userPtr + 0x50);
              lVar24 = lVar13 - (long)piVar33;
              if (lVar24 != 0 && (long)piVar33 <= lVar13) {
                memset((void *)((long)(local_f8->colname + lVar13 * (long)pNVar31 + -0xc) *
                                (long)*(int *)((long)userPtr + 0x40) +
                               *(long *)((long)userPtr + 0x30)),0,
                       lVar24 * *(int *)((long)userPtr + 0x40));
              }
              pNVar31 = (Node *)((long)&pNVar31->operation + 1);
              pNVar20 = local_118;
            } while (local_120 != pNVar31);
          }
          iVar9 = (int)local_e8;
          if (0 < pNVar20->operation) {
            pvVar17 = (pNVar20->value).data.ptr;
            if (pvVar17 == (void *)0x0) {
              printf("invalid free(result->value.data.ptr) at %s:%d\n",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                     ,0x4df);
              pNVar20 = local_118;
            }
            else {
              free(pvVar17);
              pNVar20 = local_118;
            }
          }
        }
        else {
          undef = '\0';
          local_e0 = firstrow;
          if (0 < (long)local_108) {
            plVar19 = &pNVar20->value;
            lVar13 = *(long *)((long)userPtr + 0x50);
            pNVar31 = (Node *)0x0;
            do {
              pPVar27 = local_f0;
              piVar12 = local_100;
              local_128 = 0;
              if (0 < lVar13) {
                do {
                  ffcvtn(pPVar27->datatype,&plVar19->data,&undef,(pNVar20->value).nelem,
                         **(int **)((long)userPtr + 0x68),*(void **)((long)userPtr + 0x38),
                         (void *)((long)*(int *)((long)userPtr + 0x40) *
                                  (lVar13 * (long)pNVar31 + local_128) +
                                 *(long *)((long)userPtr + 0x30)),&local_10c,piVar12);
                  local_128 = local_128 + 1;
                  lVar13 = *(long *)((long)userPtr + 0x50);
                  pNVar20 = local_118;
                } while ((long)local_128 < lVar13);
              }
              pNVar31 = (Node *)((long)&pNVar31->operation + 1);
            } while (pNVar31 != local_120);
          }
          pPVar27 = local_f0;
          piVar12 = local_100;
          firstrow = local_e0;
          iVar9 = (int)local_e8;
        }
        iVar10 = *piVar12;
        if (iVar10 == -0xb) {
          *piVar12 = 0x19c;
          ffpmsg("Numerical overflow while converting expression to necessary datatype");
          goto LAB_001268f6;
        }
      }
      else {
        if (iVar4 == 0x105) {
          if (**(int **)((long)userPtr + 0x68) == 0x10) {
            iVar10 = local_10c;
            if (iVar9 == 0) {
              local_128 = 0;
              pPVar27 = local_f0;
              if (0 < (long)local_108) {
                do {
                  if ((local_118->value).undef[local_128] == '\0') {
                    pdVar26 = (local_118->value).data.dblptr + local_128;
                  }
                  else {
                    pdVar26 = *(double **)((long)userPtr + 0x38);
                    iVar10 = 1;
                  }
                  strcpy(*(char **)(*(long *)((long)userPtr + 0x30) + local_128 * 8),
                         (char *)*pdVar26);
                  local_128 = local_128 + 1;
                  pPVar27 = local_f0;
                } while ((long)local_128 < (long)local_120);
              }
            }
            else {
              local_128 = 0;
              if (0 < (long)local_108) {
                do {
                  strcpy(*(char **)(*(long *)((long)userPtr + 0x30) + local_128 * 8),
                         &(pNVar20->value).data.log);
                  local_128 = local_128 + 1;
                  iVar10 = local_10c;
                } while ((long)local_128 < (long)local_120);
              }
            }
          }
          else {
            ffpmsg("Cannot convert string expression to desired type.");
            *piVar12 = 0x1b0;
            iVar10 = local_10c;
          }
          local_10c = iVar10;
          if (0 < local_118->operation) {
            pcVar15 = *(local_118->value).data.strptr;
            if (pcVar15 == (char *)0x0) {
              printf("invalid free(result->value.data.strptr[0]) at %s:%d\n",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                     ,0x535);
            }
            else {
              free(pcVar15);
            }
            pvVar17 = (local_118->value).data.ptr;
            if (pvVar17 != (void *)0x0) goto LAB_001268cb;
            uVar25 = 0x536;
LAB_001268e5:
            printf("invalid free(result->value.data.strptr) at %s:%d\n",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                   ,uVar25);
          }
        }
        else if (iVar4 == 0x106) {
          iVar10 = **(int **)((long)userPtr + 0x68);
          if (iVar10 < 0xe) {
            if (iVar10 == 1) {
LAB_00126556:
              if (iVar9 == 0) {
                if (0 < (long)local_108) {
                  pNVar31 = (Node *)0x0;
                  do {
                    local_128 = 0;
                    lVar13 = (pNVar20->value).nelem;
                    if (0 < lVar13) {
                      do {
                        *(bool *)(lVar13 * (long)pNVar31 +
                                 *(long *)((long)userPtr + 0x30) + local_128) =
                             *(char *)((long)(pNVar20->value).data.dblptr[(long)pNVar31] + local_128
                                      ) == '1';
                        local_128 = local_128 + 1;
                        lVar13 = (pNVar20->value).nelem;
                      } while ((long)local_128 < lVar13);
                    }
                    pNVar31 = (Node *)((long)&pNVar31->operation + 1);
                  } while (pNVar31 != local_120);
                }
              }
              else if (0 < (long)local_108) {
                pNVar31 = (Node *)0x0;
                do {
                  local_128 = 0;
                  lVar13 = (pNVar20->value).nelem;
                  if (0 < lVar13) {
                    do {
                      *(bool *)(lVar13 * (long)pNVar31 + *(long *)((long)userPtr + 0x30) + local_128
                               ) = *(char *)((long)(pNVar20->value).naxes + local_128 + 0x30) == '1'
                      ;
                      local_128 = local_128 + 1;
                      lVar13 = (pNVar20->value).nelem;
                    } while ((long)local_128 < lVar13);
                  }
                  pNVar31 = (Node *)((long)&pNVar31->operation + 1);
                } while (pNVar31 != local_120);
              }
            }
            else if (iVar10 == 0xb) {
              if (0 < (long)local_108) {
                lVar13 = -1;
                pNVar31 = (Node *)0x0;
                do {
                  local_128 = 0;
                  if (0 < (pNVar20->value).nelem) {
                    do {
                      if ((local_128 & 7) == 0) {
                        *(undefined1 *)(*(long *)((long)userPtr + 0x30) + 1 + lVar13) = 0;
                        lVar13 = lVar13 + 1;
                      }
                      if (iVar9 == 0) {
                        cVar3 = *(char *)((long)(pNVar20->value).data.dblptr[(long)pNVar31] +
                                         local_128);
                      }
                      else {
                        cVar3 = *(char *)((long)(pNVar20->value).naxes + local_128 + 0x30);
                      }
                      if (cVar3 == '1') {
                        bVar8 = (byte)local_128;
                        bVar28 = bVar8 + 7;
                        if (-1 < (long)local_128) {
                          bVar28 = bVar8;
                        }
                        pbVar1 = (byte *)(*(long *)((long)userPtr + 0x30) + lVar13);
                        *pbVar1 = *pbVar1 | (byte)(0x80 >> (bVar8 - (bVar28 & 0xf8) & 0x1f));
                      }
                      local_128 = local_128 + 1;
                    } while ((long)local_128 < (pNVar20->value).nelem);
                  }
                  pNVar31 = (Node *)((long)&pNVar31->operation + 1);
                } while (pNVar31 != local_120);
              }
            }
            else {
LAB_001266ef:
              ffpmsg("Cannot convert bit expression to desired type.");
              *piVar12 = 0x1b0;
            }
          }
          else {
            if (iVar10 == 0xe) goto LAB_00126556;
            if (iVar10 != 0x10) goto LAB_001266ef;
            local_128 = 0;
            if (iVar9 == 0) {
              if (0 < (long)local_108) {
                do {
                  strcpy(*(char **)(*(long *)((long)userPtr + 0x30) + local_128 * 8),
                         (char *)(local_118->value).data.dblptr[local_128]);
                  local_128 = local_128 + 1;
                } while ((long)local_128 < (long)local_120);
              }
            }
            else if (0 < (long)local_108) {
              do {
                strcpy(*(char **)(*(long *)((long)userPtr + 0x30) + local_128 * 8),
                       &(pNVar20->value).data.log);
                local_128 = local_128 + 1;
              } while ((long)local_128 < (long)local_120);
            }
          }
          if (0 < local_118->operation) {
            pcVar15 = *(local_118->value).data.strptr;
            if (pcVar15 == (char *)0x0) {
              printf("invalid free(result->value.data.strptr[0]) at %s:%d\n",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                     ,0x51b);
            }
            else {
              free(pcVar15);
            }
            pvVar17 = (local_118->value).data.ptr;
            if (pvVar17 == (void *)0x0) {
              uVar25 = 0x51c;
              goto LAB_001268e5;
            }
LAB_001268cb:
            free(pvVar17);
          }
        }
LAB_001268f6:
        iVar10 = *piVar12;
        pNVar20 = local_118;
      }
      firstrow = (long)local_120->SubNodes + firstrow + -0x14;
      if (iVar10 != 0) break;
      if (pNVar20->type == 0x105) {
        lVar13 = (long)*(int *)((long)userPtr + 0x40) * (long)local_120 +
                 *(long *)((long)userPtr + 0x30);
      }
      else {
        if ((pNVar20->type == 0x106) && (**(int **)((long)userPtr + 0x68) == 0xb)) {
          lVar24 = (pNVar20->value).nelem;
          lVar13 = lVar24 + 7;
          lVar24 = lVar24 + 0xe;
          if (-1 < lVar13) {
            lVar24 = lVar13;
          }
          lVar13 = (long)*(int *)((long)userPtr + 0x40) * (long)local_120 * (lVar24 >> 3);
        }
        else {
          lVar13 = (long)*(int *)((long)userPtr + 0x40) * (long)local_120 *
                   *(long *)((long)userPtr + 0x50);
        }
        lVar13 = lVar13 + *(long *)((long)userPtr + 0x30);
      }
      *(long *)((long)userPtr + 0x30) = lVar13;
      pNVar31 = (Node *)((long)local_108 - (long)local_120);
    } while (pNVar31 != (Node *)0x0);
  }
  lVar13 = local_c0;
  piVar33 = local_d0;
  puVar18 = *(undefined8 **)((long)userPtr + 0x38);
  __dest = (undefined8 *)local_d0[-1].array;
  if ((puVar18 != __dest) && (local_b0 == (long)__dest + (long)*(int *)((long)userPtr + 0x40))) {
    if (**(int **)((long)userPtr + 0x68) == 0x10) {
      *(undefined2 *)__dest = *(undefined2 *)*puVar18;
    }
    else {
      memcpy(__dest,puVar18,(long)*(int *)((long)userPtr + 0x40));
    }
  }
  if (local_10c == 0) {
    puVar18 = *(undefined8 **)((long)userPtr + 0x38);
    if (puVar18 == (undefined8 *)piVar33[-1].array) {
      if (**(int **)((long)userPtr + 0x68) == 0x10) {
        *(undefined2 *)*puVar18 = (undefined2)zeros[0];
      }
      else {
        memcpy(puVar18,zeros,(long)*(int *)((long)userPtr + 0x40));
      }
    }
  }
  else {
    *(undefined4 *)(*(long *)((long)userPtr + 0x68) + 0x20) = 1;
  }
  if ((((pPVar27->hdutype == 0) || (firstrow + -1 != *(long *)((long)userPtr + 0x48))) ||
      (pPVar27->status != 0)) ||
     (iVar9 = -1, lVar13 <= *(long *)(*(long *)((long)userPtr + 0x68) + 0x18))) {
    iVar9 = pPVar27->status;
  }
  return iVar9;
}

Assistant:

int fits_parser_workfn( long    totalrows,     /* I - Total rows to be processed     */
                long    offset,        /* I - Number of rows skipped at start*/
                long    firstrow,      /* I - First row of this iteration    */
                long    nrows,         /* I - Number of rows in this iter    */
                int      nCols,        /* I - Number of columns in use       */
                iteratorCol *colData,  /* IO- Column information/data        */
                void    *userPtr )     /* I - Data handling instructions     */
/*                                                                           */
/* Iterator work function which calls the parser and copies the results      */
/* into either an OutputCol or a data pointer supplied in the userPtr        */
/* structure.                                                                */
/*---------------------------------------------------------------------------*/
{
    int status, constant=0, anyNullThisTime=0;
    long jj, kk, idx, remain, ntodo;
    Node *result;
    iteratorCol * outcol;
    ParseData *lParse = ((parseInfo*)userPtr)->parseData;
    struct ParseStatusVariables *pv = &( ((parseInfo*)userPtr)->parseVariables );
    void *Data0 = 0;

    /* declare variables static to preserve their values between calls */
    long zeros[4] = {0,0,0,0};

    if (DEBUG_PIXFILTER)
       printf("fits_parser_workfn(total=%ld, offset=%ld, first=%ld, rows=%ld, cols=%d)\n",
                totalrows, offset, firstrow, nrows, nCols);
    /*--------------------------------------------------------*/
    /*  Initialization procedures: execute on the first call  */
    /*--------------------------------------------------------*/
    outcol = colData + (nCols - 1);
    if (firstrow == offset+1)
    {
       (pv->userInfo) = (parseInfo*)userPtr;
       (pv->userInfo)->anyNull = 0;

       /* Unfortunately there are two copies of the iterator columns,
	  one inside the parser and one outside maintained by the
	  higher level.  (This could happen if the histogramming
	  routines are binning multiple columns, and so there are
	  multiple parsers being managed at one time.) Upon the first
	  call we make sure they match */
       for (jj = 0; jj<nCols; jj++) {
	 lParse->colData[jj].repeat = colData[jj].repeat;
       }

       if( (pv->userInfo)->maxRows>0 )
          (pv->userInfo)->maxRows = minvalue(totalrows,(pv->userInfo)->maxRows);
       else if( (pv->userInfo)->maxRows<0 )
          (pv->userInfo)->maxRows = totalrows;
       else
          (pv->userInfo)->maxRows = nrows;

       (pv->lastRow) = firstrow + (pv->userInfo)->maxRows - 1;

       /* dataPtr == NULL indicates an iterator-derived column, which
	  means that the first value will be a null value and the remaining
	  values will be the where the outputs are placed */
       if( (pv->userInfo)->dataPtr==NULL ) {

          if( outcol->iotype == InputCol ) {
             ffpmsg("Output column for parser results not found!");
             return( PARSE_NO_OUTPUT );
          }
          /* Data gets set later */
          (pv->Null) = outcol->array;
          (pv->userInfo)->datatype = outcol->datatype;

          /* Check for a TNULL/BLANK keyword for output column/image */

          status = 0;
          (pv->jnull) = 0;
          if (lParse->hdutype == IMAGE_HDU) {
             if (lParse->pixFilter->blank)
                (pv->jnull) = (LONGLONG) lParse->pixFilter->blank;
          }
          else {
	    if (outcol->iotype != TemporaryCol) {
	      ffgknjj( outcol->fptr, "TNULL", outcol->colnum,
		       1, &(pv->jnull), (int*)&jj, &status );
	    }

             if( status==BAD_INTKEY || outcol->iotype == TemporaryCol) {
                /*  Probably ASCII table with text TNULL keyword  */
                switch( (pv->userInfo)->datatype ) {
                   case TSHORT:  (pv->jnull) = (LONGLONG) SHRT_MIN;      break;
                   case TINT:    (pv->jnull) = (LONGLONG) INT_MIN;       break;
                   case TLONG:   (pv->jnull) = (LONGLONG) LONG_MIN;      break;
                }
             }
          }
          (pv->repeat) = outcol->repeat;
/*
          if (DEBUG_PIXFILTER)
            printf("fits_parser_workfn: using null value %ld\n", (pv->jnull));
*/
       } else {

	  /* This clause applies if the user is passing user-allocated 
	     data arrays, which is where the data will be placed.  This 
	     means they should also be passing null values */
          (pv->Data) = (pv->userInfo)->dataPtr;
          (pv->Null) = ((pv->userInfo)->nullPtr ? (pv->userInfo)->nullPtr : zeros);
          (pv->repeat) = lParse->Nodes[lParse->resultNode].value.nelem;

       }

       /* Determine the size of each element of the returned result */

       switch( (pv->userInfo)->datatype ) {
       case TBIT:       /*  Fall through to TBYTE  */
       case TLOGICAL:   /*  Fall through to TBYTE  */
       case TBYTE:     (pv->datasize) = sizeof(char);     break;
       case TSHORT:    (pv->datasize) = sizeof(short);    break;
       case TINT:      (pv->datasize) = sizeof(int);      break;
       case TLONG:     (pv->datasize) = sizeof(long);     break;
       case TLONGLONG: (pv->datasize) = sizeof(LONGLONG); break;
       case TFLOAT:    (pv->datasize) = sizeof(float);    break;
       case TDOUBLE:   (pv->datasize) = sizeof(double);   break;
       case TSTRING:   (pv->datasize) = sizeof(char*);    break;
       }

       /* Determine the size of each element of the calculated result */
       /*   (only matters for numeric/logical data)                   */

       switch( lParse->Nodes[lParse->resultNode].type ) {
       case BOOLEAN:   (pv->resDataSize) = sizeof(char);    break;
       case LONG:      (pv->resDataSize) = sizeof(long);    break;
       case DOUBLE:    (pv->resDataSize) = sizeof(double);  break;
       }
    }

    /*-------------------------------------------*/
    /*  Main loop: process all the rows of data  */
    /*-------------------------------------------*/

    /*  If writing to output column, set first element to appropriate  */
    /*  null value.  If no NULLs encounter, zero out before returning. */
/*
          if (DEBUG_PIXFILTER)
            printf("fits_parser_workfn: using null value %ld\n", (pv->jnull));
*/

    if( (pv->userInfo)->dataPtr == NULL ) {
       /* First, reset Data pointer to start of output array, plus 1
	  because the 0th element is the null value (cute undocumented
	  feature of the iterator!) */
       (pv->Data) = (char*) outcol->array + (pv->datasize);

       /* A TemporaryCol with null value specified explicitly */
       if (outcol->iotype == TemporaryCol && (pv->userInfo)->nullPtr) {

	 pv->Null = (pv->userInfo)->nullPtr;

       } else {

	 /* ... or an OutputCol or TemporaryCol with no explicit null */
	 switch( (pv->userInfo)->datatype ) {
	 case TLOGICAL: *(char  *)(pv->Null) = 'U';             break;
	 case TBYTE:    *(char  *)(pv->Null) = (char )(pv->jnull);    break;
	 case TSHORT:   *(short *)(pv->Null) = (short)(pv->jnull);    break;
	 case TINT:     *(int   *)(pv->Null) = (int  )(pv->jnull);    break;
	 case TLONG:    *(long  *)(pv->Null) = (long )(pv->jnull);    break;
	 case TLONGLONG: *(LONGLONG  *)(pv->Null) = (LONGLONG )(pv->jnull);    break;
	 case TFLOAT:   *(float *)(pv->Null) = FLOATNULLVALUE;  break;
	 case TDOUBLE:  *(double*)(pv->Null) = DOUBLENULLVALUE; break;
	 case TSTRING: (*(char **)(pv->Null))[0] = '\1';
	               (*(char **)(pv->Null))[1] = '\0';        break;
	 }
       }
    }

    /* Alter nrows in case calling routine didn't want to do all rows */

    Data0 = pv->Data; /* Record starting point */
    nrows = minvalue(nrows,(pv->lastRow)-firstrow+1);

    Setup_DataArrays( lParse, nCols, colData, firstrow, nrows );

    /* Parser allocates arrays for each column and calculation it performs. */
    /* Limit number of rows processed during each pass to reduce memory     */
    /* requirements... In most cases, iterator will limit rows to less      */
    /* than 10000 rows per iteration, so this is really only relevant for    */
    /* hk-compressed files which must be decompressed in memory and sent    */
    /* whole to fits_parser_workfn in a single iteration.                           */

    remain = nrows;
    while( remain ) {
       ntodo = minvalue(remain,10000);
       Evaluate_Parser ( lParse, firstrow, ntodo );
       if( lParse->status ) break;

       firstrow += ntodo;
       remain   -= ntodo;

       /*  Copy results into data array  */

       result = lParse->Nodes + lParse->resultNode;
       if( result->operation==CONST_OP ) constant = 1;

       switch( result->type ) {

       case BOOLEAN:
       case LONG:
       case DOUBLE:
          if( constant ) {
             char undef=0;
             for( kk=0; kk<ntodo; kk++ )
                for( jj=0; jj<(pv->repeat); jj++ )
                   ffcvtn( lParse->datatype,
                           &(result->value.data),
                           &undef, result->value.nelem /* 1 */,
                           (pv->userInfo)->datatype, (pv->Null),
                           (char*)(pv->Data) + (kk*(pv->repeat)+jj)*(pv->datasize),
                           &anyNullThisTime, &lParse->status );
          } else {
             if ( (pv->repeat) == result->value.nelem ) {
                ffcvtn( lParse->datatype,
                        result->value.data.ptr,
                        result->value.undef,
                        result->value.nelem*ntodo,
                        (pv->userInfo)->datatype, (pv->Null), (pv->Data),
                        &anyNullThisTime, &lParse->status );
             } else if( result->value.nelem == 1 ) {
                for( kk=0; kk<ntodo; kk++ )
                   for( jj=0; jj<(pv->repeat); jj++ ) {
                      ffcvtn( lParse->datatype,
                              (char*)result->value.data.ptr + kk*(pv->resDataSize),
                              (char*)result->value.undef + kk,
                              1, (pv->userInfo)->datatype, (pv->Null),
                              (char*)(pv->Data) + (kk*(pv->repeat)+jj)*(pv->datasize),
                              &anyNullThisTime, &lParse->status );
                   }
             } else {
                int nCopy;
                nCopy = minvalue( (pv->repeat), result->value.nelem );
                for( kk=0; kk<ntodo; kk++ ) {
                   ffcvtn( lParse->datatype,
                           (char*)result->value.data.ptr
                                  + kk*result->value.nelem*(pv->resDataSize),
                           (char*)result->value.undef
                                  + kk*result->value.nelem,
                           nCopy, (pv->userInfo)->datatype, (pv->Null),
                           (char*)(pv->Data) + (kk*(pv->repeat))*(pv->datasize),
                           &anyNullThisTime, &lParse->status );
                   if( nCopy < (pv->repeat) ) {
                      memset( (char*)(pv->Data) + (kk*(pv->repeat)+nCopy)*(pv->datasize),
                              0, ((pv->repeat)-nCopy)*(pv->datasize));
                   }
                }

             }
             if( result->operation>0 ) {
                FREE( result->value.data.ptr );
             }
          }
          if( lParse->status==OVERFLOW_ERR ) {
             lParse->status = NUM_OVERFLOW;
             ffpmsg("Numerical overflow while converting expression to necessary datatype");
          }
          break;

       case BITSTR:
          switch( (pv->userInfo)->datatype ) {
          case TBYTE:
             idx = -1;
             for( kk=0; kk<ntodo; kk++ ) {
                for( jj=0; jj<result->value.nelem; jj++ ) {
                   if( jj%8 == 0 )
                      ((char*)(pv->Data))[++idx] = 0;
                   if( constant ) {
                      if( result->value.data.str[jj]=='1' )
                         ((char*)(pv->Data))[idx] |= 128>>(jj%8);
                   } else {
                      if( result->value.data.strptr[kk][jj]=='1' )
                         ((char*)(pv->Data))[idx] |= 128>>(jj%8);
                   }
                }
             }
             break;
          case TBIT:
          case TLOGICAL:
             if( constant ) {
                for( kk=0; kk<ntodo; kk++ )
                   for( jj=0; jj<result->value.nelem; jj++ ) {
                      ((char*)(pv->Data))[ jj+kk*result->value.nelem ] =
                         ( result->value.data.str[jj]=='1' );
                   }
             } else {
                for( kk=0; kk<ntodo; kk++ )
                   for( jj=0; jj<result->value.nelem; jj++ ) {
                      ((char*)(pv->Data))[ jj+kk*result->value.nelem ] =
                         ( result->value.data.strptr[kk][jj]=='1' );
                   }
             }
             break; 
          case TSTRING:
             if( constant ) {
                for( jj=0; jj<ntodo; jj++ ) {
                   strcpy( ((char**)(pv->Data))[jj], result->value.data.str );
                }
             } else {
                for( jj=0; jj<ntodo; jj++ ) {
                   strcpy( ((char**)(pv->Data))[jj], result->value.data.strptr[jj] );
                }
             }
             break;
          default:
             ffpmsg("Cannot convert bit expression to desired type.");
             lParse->status = PARSE_BAD_TYPE;
             break;
          }
          if( result->operation>0 ) {
             FREE( result->value.data.strptr[0] );
             FREE( result->value.data.strptr );
          }
          break;

       case STRING:
          if( (pv->userInfo)->datatype==TSTRING ) {
             if( constant ) {
                for( jj=0; jj<ntodo; jj++ )
                   strcpy( ((char**)(pv->Data))[jj], result->value.data.str );
             } else {
                for( jj=0; jj<ntodo; jj++ )
                   if( result->value.undef[jj] ) {
                      anyNullThisTime = 1;
                      strcpy( ((char**)(pv->Data))[jj],
                              *(char **)(pv->Null) );
                   } else {
                      strcpy( ((char**)(pv->Data))[jj],
                              result->value.data.strptr[jj] );
                   }
             }
          } else {
             ffpmsg("Cannot convert string expression to desired type.");
             lParse->status = PARSE_BAD_TYPE;
          }
          if( result->operation>0 ) {
             FREE( result->value.data.strptr[0] );
             FREE( result->value.data.strptr );
          }
          break;
       }

       if( lParse->status ) break;

       /*  Increment Data to point to where the next block should go  */

       if( result->type==BITSTR && (pv->userInfo)->datatype==TBYTE )
          (pv->Data) = (char*)(pv->Data)
                    + (pv->datasize) * ( (result->value.nelem+7)/8 ) * ntodo;
       else if( result->type==STRING )
          (pv->Data) = (char*)(pv->Data) + (pv->datasize) * ntodo;
       else
          (pv->Data) = (char*)(pv->Data) + (pv->datasize) * ntodo * (pv->repeat);
    }

    /* If a TemporaryCol output is used, we want to inform the caller
       what the null value is expected to be */
    if (pv->Null != outcol->array && 
	(Data0) == (char*) outcol->array + (pv->datasize)) {
      if( (pv->userInfo)->datatype == TSTRING )
	memcpy( outcol->array, *(char **)(pv->Null), 2 );
      else 
	memcpy( outcol->array, (pv->Null), (pv->datasize) );
    }

    /* If no NULLs encountered during this pass, set Null value to */
    /* zero to make the writing of the output column data faster   */

    if( anyNullThisTime )
       (pv->userInfo)->anyNull = 1;
    else if( pv->Null == outcol->array ) {
       if( (pv->userInfo)->datatype == TSTRING )
          memcpy( *(char **)(pv->Null), zeros, 2 );
       else 
          memcpy( (pv->Null), zeros, (pv->datasize) );
    }

    /*-------------------------------------------------------*/
    /*  Clean up procedures:  after processing all the rows  */
    /*-------------------------------------------------------*/

    /*  if the calling routine specified that only a limited number    */
    /*  of rows in the table should be processed, return a value of -1 */
    /*  once all the rows have been done, if no other error occurred.  */

    if (lParse->hdutype != IMAGE_HDU && firstrow - 1 == (pv->lastRow)) {
           if (!lParse->status && (pv->userInfo)->maxRows<totalrows) {
                  return (-1);
           }
    }

    return(lParse->status);  /* return successful status */
}